

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_compute_pipeline
          (Impl *this,VkComputePipelineCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkComputePipelineCreateInfo **out_create_info)

{
  VkSpecializationInfo *info;
  bool bVar1;
  VkComputePipelineCreateInfo *pVVar2;
  VkPipelineCreateFlags2CreateInfo *pVVar3;
  size_t sVar4;
  char *pcVar5;
  VkPipeline pVVar6;
  uint uVar7;
  long *in_FS_OFFSET;
  
  pVVar2 = copy<VkComputePipelineCreateInfo>(this,create_info,1,alloc);
  uVar7 = pVVar2->flags & 0x7ffffc3f;
  pVVar2->flags = uVar7;
  pVVar3 = find_pnext<VkPipelineCreateFlags2CreateInfo>((VkStructureType)pVVar2->pNext,create_info);
  pVVar6 = (VkPipeline)0x0;
  if (pVVar3 != (VkPipelineCreateFlags2CreateInfo *)0x0) {
    uVar7 = 0;
  }
  pVVar2->flags = uVar7;
  if ((uVar7 & 4) != 0) {
    if (pVVar2->basePipelineHandle != (VkPipeline)0x0) goto LAB_00117a38;
    uVar7 = pVVar2->basePipelineIndex;
    if ((long)(int)uVar7 < 0) goto LAB_00117a38;
    if (base_pipeline_count <= uVar7) {
      if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
        return false;
      }
      bVar1 = Internal::log_thread_callback(LOG_ERROR,"Base pipeline index is out of range.\n");
      if (!bVar1) {
        fwrite("Fossilize ERROR: Base pipeline index is out of range.\n",0x36,1,_stderr);
        return false;
      }
      return false;
    }
    pVVar6 = base_pipelines[(int)uVar7];
  }
  pVVar2->basePipelineHandle = pVVar6;
LAB_00117a38:
  pVVar2->basePipelineIndex = -1;
  info = (pVVar2->stage).pSpecializationInfo;
  if (info != (VkSpecializationInfo *)0x0) {
    copy_specialization_info(this,info,alloc,&(pVVar2->stage).pSpecializationInfo);
  }
  pcVar5 = (pVVar2->stage).pName;
  sVar4 = strlen(pcVar5);
  pcVar5 = copy<char>(this,pcVar5,sVar4 + 1,alloc);
  (pVVar2->stage).pName = pcVar5;
  bVar1 = copy_pnext_chain(this,(pVVar2->stage).pNext,alloc,&(pVVar2->stage).pNext,
                           (DynamicStateInfo *)0x0,0);
  if (!bVar1) {
    return false;
  }
  bVar1 = add_module_identifier(&pVVar2->stage,alloc,device,gsmcii);
  if (!bVar1) {
    return false;
  }
  bVar1 = copy_pnext_chain(this,pVVar2->pNext,alloc,&pVVar2->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar1) {
    *out_create_info = pVVar2;
    return true;
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::copy_compute_pipeline(const VkComputePipelineCreateInfo *create_info, ScratchAllocator &alloc,
                                                const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                                VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                VkComputePipelineCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (info->stage.pSpecializationInfo)
		if (!copy_specialization_info(info->stage.pSpecializationInfo, alloc, &info->stage.pSpecializationInfo))
			return false;

	info->stage.pName = copy(info->stage.pName, strlen(info->stage.pName) + 1, alloc);

	if (!copy_pnext_chain(info->stage.pNext, alloc, &info->stage.pNext, nullptr, 0))
		return false;

	if (!add_module_identifier(&info->stage, alloc, device, gsmcii))
		return false;

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}